

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

MarbleTexture *
pbrt::MarbleTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 *puVar3;
  MarbleTexture *pMVar4;
  
  local_b8._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
  local_b8._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
  local_b8.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
  local_b8.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
  uStack_98 = *(undefined8 *)(renderFromTexture->mInv).m[2];
  uStack_90 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
  uStack_88 = *(undefined8 *)(renderFromTexture->mInv).m[3];
  uStack_80 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
  local_78 = *(undefined8 *)(renderFromTexture->m).m[0];
  uStack_70 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
  uStack_68 = *(undefined8 *)(renderFromTexture->m).m[1];
  uStack_60 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
  uStack_58 = *(undefined8 *)(renderFromTexture->m).m[2];
  uStack_50 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
  uStack_48 = *(undefined8 *)(renderFromTexture->m).m[3];
  uStack_40 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  *puVar3 = local_b8._M_dataplus._M_p;
  puVar3[1] = local_b8._M_string_length;
  puVar3[2] = local_b8.field_2._M_allocated_capacity;
  puVar3[3] = local_b8.field_2._8_8_;
  puVar3[4] = uStack_98;
  puVar3[5] = uStack_90;
  puVar3[6] = uStack_88;
  puVar3[7] = uStack_80;
  puVar3[8] = local_78;
  puVar3[9] = uStack_70;
  puVar3[10] = uStack_68;
  puVar3[0xb] = uStack_60;
  puVar3[0xc] = uStack_58;
  puVar3[0xd] = uStack_50;
  puVar3[0xe] = uStack_48;
  puVar3[0xf] = uStack_40;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"octaves","");
  iVar1 = TextureParameterDictionary::GetOneInt(parameters,&local_b8,8);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"roughness","");
  FVar5 = TextureParameterDictionary::GetOneFloat(parameters,&local_d8,0.5);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"scale","");
  FVar6 = TextureParameterDictionary::GetOneFloat(parameters,&local_118,1.0);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"variation","");
  FVar7 = TextureParameterDictionary::GetOneFloat(parameters,&local_f8,0.2);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pMVar4 = (MarbleTexture *)CONCAT44(extraout_var_00,iVar2);
  (pMVar4->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
       (ulong)puVar3 | 0x1000000000000;
  pMVar4->octaves = iVar1;
  pMVar4->omega = FVar5;
  pMVar4->scale = FVar6;
  pMVar4->variation = FVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return pMVar4;
}

Assistant:

MarbleTexture *MarbleTexture::Create(const Transform &renderFromTexture,
                                     const TextureParameterDictionary &parameters,
                                     const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3DHandle map =
        TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<MarbleTexture>(
        map, parameters.GetOneInt("octaves", 8), parameters.GetOneFloat("roughness", .5f),
        parameters.GetOneFloat("scale", 1.f), parameters.GetOneFloat("variation", .2f));
}